

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::InnerScopeFromIndex(InterpreterStackFrame *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  long lVar5;
  
  uVar3 = FunctionBody::GetCountField(*(FunctionBody **)(this + 0x88),InnerScopeCount);
  if (index < uVar3) {
    lVar5 = *(long *)(this + 0x68);
    if (lVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x41f,"(this->innerScopeArray != nullptr)",
                                  "this->innerScopeArray != nullptr");
      if (!bVar2) goto LAB_00973d95;
      *puVar4 = 0;
      lVar5 = *(long *)(this + 0x68);
    }
    return *(Var *)(lVar5 + (ulong)index * 8);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x41c,"(false)","Illegal byte code: bad inner scope index");
  if (bVar2) {
    *puVar4 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00973d95:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Var InterpreterStackFrame::InnerScopeFromIndex(uint32 index) const
    {
        if (index >= m_functionBody->GetInnerScopeCount())
        {
            AssertMsg(false, "Illegal byte code: bad inner scope index");
            Js::Throw::FatalInternalError();
        }
        Assert(this->innerScopeArray != nullptr);
        return this->innerScopeArray[index];
    }